

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroup::TemplatedScan<(duckdb::TableScanType)3>
          (RowGroup *this,TransactionData transaction,CollectionScanState *state,DataChunk *result)

{
  idx_t *piVar1;
  double *pdVar2;
  TableScanState *pTVar3;
  idx_t iVar4;
  BlockManager *pBVar5;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var6;
  size_type __n;
  _Head_base<0UL,_duckdb::LocalStorage_*,_false> _Var7;
  idx_t iVar8;
  data_ptr_t pdVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  FilterPropagateResult FVar14;
  int iVar15;
  const_reference pvVar16;
  ColumnData *pCVar17;
  ulong uVar18;
  reference pvVar19;
  reference pvVar20;
  const_reference pvVar21;
  ulong uVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  const_iterator __begin5;
  pointer pSVar24;
  size_type __n_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  long lVar27;
  CollectionScanState *pCVar28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var29;
  size_type sVar30;
  pointer pSVar31;
  _func_int **pp_Var32;
  double dVar33;
  idx_t approved_tuple_count;
  optional_ptr<duckdb::AdaptiveFilter,_true> adaptive_filter;
  PrefetchState prefetch_state;
  optional_ptr<duckdb::DuckTransaction,_true> in_stack_fffffffffffffeb8;
  undefined1 local_110 [48];
  vector<duckdb::StorageIndex,_true> *local_e0;
  SelectionVector local_d8;
  __atomic_base<unsigned_long> local_c0;
  SelectionVector *local_b8;
  DuckTransactionManager *local_b0;
  _Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> local_a8;
  buffer_ptr<SelectionData> *local_a0;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> local_98;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_90;
  _Tuple_impl<0UL,_duckdb::LocalStorage_*,_std::default_delete<duckdb::LocalStorage>_> local_88;
  _Head_base<0UL,_duckdb::StorageLockKey_*,_false> local_80;
  __native_type local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pTVar3 = state->parent;
  local_e0 = &pTVar3->column_ids;
  local_c0._M_i = (__int_type)&pTVar3->filters;
  local_90.ptr = (UndoBufferEntry *)&state->random;
  local_b8 = &state->valid_sel;
  local_a0 = &(state->valid_sel).selection_data;
  local_80._M_head_impl = (StorageLockKey *)&(pTVar3->filters).filter_list;
  local_88.super__Head_base<0UL,_duckdb::LocalStorage_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LocalStorage_*,_false>)(LocalStorage *)0xffffffffffffffff;
  local_110._16_8_ = result;
  local_110._24_8_ = state;
  do {
    uVar11 = local_110._24_8_;
    iVar4 = *(idx_t *)(local_110._24_8_ + 8);
    pp_Var32 = (_func_int **)(iVar4 * 0x800);
    p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_110._24_8_ + 0x10))->
               _vptr__Sp_counted_base + iVar4 * -0x100);
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_110._24_8_ + 0x10))->
        _vptr__Sp_counted_base < pp_Var32 ||
        p_Var29 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7ff < p_Var29) {
      p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
    }
    if (((((TableScanState *)
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_110._24_8_ + 0x80))->
          _vptr__Sp_counted_base)->sampling_info).do_system_sample != true) ||
       (dVar33 = RandomEngine::NextRandom((RandomEngine *)local_90.ptr),
       pdVar2 = &(((TableScanState *)
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar11 + 0x80))->
                  _vptr__Sp_counted_base)->sampling_info).sample_rate,
       dVar33 < *pdVar2 || dVar33 == *pdVar2)) {
      bVar13 = CheckZonemapSegments(this,(CollectionScanState *)uVar11);
      iVar15 = 2;
      if (bVar13) {
        local_110._32_8_ =
             GetCommittedSelVector
                       (*(RowGroup **)uVar11,transaction.start_time,transaction.transaction_id,
                        *(idx_t *)(uVar11 + 8),local_b8,(idx_t)p_Var29);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._32_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          NextVector(this,(CollectionScanState *)uVar11);
        }
        else {
          pBVar5 = ((this->collection)._M_data)->block_manager;
          iVar15 = (*pBVar5->_vptr_BlockManager[0x12])(pBVar5);
          if ((char)iVar15 != '\0') {
            local_78.__align = 0;
            local_78._8_8_ = 0;
            local_78._16_8_ = 0;
            if ((pTVar3->column_ids).
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (pTVar3->column_ids).
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              lVar27 = 0;
              sVar30 = 0;
              do {
                pvVar16 = vector<duckdb::StorageIndex,_true>::operator[](local_e0,sVar30);
                if (pvVar16->index != 0xffffffffffffffff) {
                  pCVar17 = GetColumn(this,pvVar16->index);
                  (*pCVar17->_vptr_ColumnData[6])
                            (pCVar17,&local_78,
                             (long)&((((unsafe_unique_array<ColumnScanState> *)
                                      &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       (local_110._24_8_ + 0x10))->_M_use_count)->
                                     super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                     )._M_t.
                                     super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                     .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                    _M_head_impl)->current + lVar27,p_Var29);
                }
                sVar30 = sVar30 + 1;
                lVar27 = lVar27 + 0x98;
              } while (sVar30 < (ulong)((long)(pTVar3->column_ids).
                                              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              .
                                              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pTVar3->column_ids).
                                              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              .
                                              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            (*pBVar5->buffer_manager->_vptr_BufferManager[8])(pBVar5->buffer_manager,&local_78);
            PrefetchState::~PrefetchState((PrefetchState *)&local_78.__data);
          }
          if (*(long *)local_c0._M_i == 0) {
            local_110._12_4_ = 0;
          }
          else {
            uVar18 = ((long)(pTVar3->filters).filter_list.
                            super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                            super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pTVar3->filters).filter_list.
                            super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                            super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            local_110._12_4_ =
                 (undefined4)
                 CONCAT71((int7)(uVar18 >> 8),(pTVar3->filters).always_true_filters < uVar18);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._32_8_ == p_Var29) &&
             (local_110[0xc] == '\0')) {
            if ((pTVar3->column_ids).
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (pTVar3->column_ids).
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              lVar27 = 0;
              sVar30 = 0;
              pCVar28 = (CollectionScanState *)local_110._24_8_;
              do {
                pvVar16 = vector<duckdb::StorageIndex,_true>::operator[](local_e0,sVar30);
                if (pvVar16->index == 0xffffffffffffffff) {
                  pvVar19 = vector<duckdb::Vector,_true>::operator[]
                                      ((vector<duckdb::Vector,_true> *)local_110._16_8_,sVar30);
                  Vector::Sequence(pvVar19,(this->super_SegmentBase<duckdb::RowGroup>).start +
                                           (long)pp_Var32,1,local_110._32_8_);
                }
                else {
                  pCVar17 = GetColumn(this,pvVar16->index);
                  iVar4 = pCVar28->vector_index;
                  _Var6._M_head_impl =
                       (((unsafe_unique_array<ColumnScanState> *)
                        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_110._24_8_ + 0x10))
                         ->_M_use_count)->
                       super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                       .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                  pvVar19 = vector<duckdb::Vector,_true>::operator[]
                                      ((vector<duckdb::Vector,_true> *)local_110._16_8_,sVar30);
                  pCVar28 = (CollectionScanState *)local_110._24_8_;
                  uVar18 = (pCVar17->count).super___atomic_base<unsigned_long>._M_i + iVar4 * -0x800
                  ;
                  if (0x7ff < uVar18) {
                    uVar18 = 0x800;
                  }
                  (*pCVar17->_vptr_ColumnData[10])
                            (pCVar17,iVar4,(long)&(_Var6._M_head_impl)->current + lVar27,pvVar19,0,
                             uVar18);
                }
                sVar30 = sVar30 + 1;
                lVar27 = lVar27 + 0x98;
              } while (sVar30 < (ulong)((long)(pTVar3->column_ids).
                                              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              .
                                              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pTVar3->column_ids).
                                              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              .
                                              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
          }
          else {
            local_110._0_8_ = local_110._32_8_;
            local_d8.sel_vector = (sel_t *)0x0;
            local_d8.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_d8.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._32_8_ == p_Var29) {
              local_d8.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_d8.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_d8.sel_vector = (sel_t *)0x0;
            }
            else {
              shared_ptr<duckdb::SelectionData,_true>::operator=(&local_d8.selection_data,local_a0);
              local_d8.sel_vector = local_b8->sel_vector;
            }
            local_a8._M_head_impl =
                 (pTVar3->filters).adaptive_filter.
                 super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
                 .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
            local_98._M_head_impl =
                 (UndoBufferEntry *)ScanFilterInfo::BeginFilter((ScanFilterInfo *)local_c0._M_i);
            if (local_110[0xc] != '\0') {
              pSVar24 = (pTVar3->filters).filter_list.
                        super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                        super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pSVar31 = (pTVar3->filters).filter_list.
                        super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                        super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              if (pSVar31 != pSVar24) {
                __n_00 = 0;
                do {
                  optional_ptr<duckdb::AdaptiveFilter,_true>::CheckValid
                            ((optional_ptr<duckdb::AdaptiveFilter,_true> *)&local_a8);
                  pvVar20 = vector<unsigned_long,_true>::operator[]
                                      (&(local_a8._M_head_impl)->permutation,__n_00);
                  pvVar21 = vector<duckdb::ScanFilter,_true>::operator[]
                                      ((vector<duckdb::ScanFilter,_true> *)local_80._M_head_impl,
                                       *pvVar20);
                  if (pvVar21->always_true == false) {
                    local_b0 = (DuckTransactionManager *)
                               unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                               ::operator*(&pvVar21->filter_state);
                    __n = pvVar21->scan_column_index;
                    _Var7._M_head_impl = (LocalStorage *)pvVar21->table_column_index;
                    local_110._40_8_ =
                         vector<duckdb::Vector,_true>::operator[]
                                   ((vector<duckdb::Vector,_true> *)local_110._16_8_,__n);
                    if ((_Head_base<0UL,_duckdb::LocalStorage_*,_false>)_Var7._M_head_impl ==
                        local_88.super__Head_base<0UL,_duckdb::LocalStorage_*,_false>._M_head_impl)
                    {
                      iVar8 = (this->super_SegmentBase<duckdb::RowGroup>).start;
                      FVar14 = CheckRowIdFilter(pvVar21->filter,iVar8 + (long)pp_Var32,
                                                (long)&p_Var29[iVar4 * 0x80]._vptr__Sp_counted_base
                                                + iVar8);
                      if (FVar14 == FILTER_ALWAYS_FALSE) {
                        local_110._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      }
                      else {
                        Vector::SetVectorType((Vector *)local_110._40_8_,FLAT_VECTOR);
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          pdVar9 = *(data_ptr_t *)(local_110._40_8_ + 0x20);
                          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                          do {
                            p_Var26 = p_Var23;
                            p_Var25 = p_Var23;
                            if (local_d8.sel_vector != (sel_t *)0x0) {
                              p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        (ulong)local_d8.sel_vector[(long)p_Var23];
                              p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        (ulong)local_d8.sel_vector[(long)p_Var23];
                            }
                            *(idx_t *)(pdVar9 + (long)p_Var26 * 8) =
                                 (long)&p_Var25[iVar4 * 0x80]._vptr__Sp_counted_base +
                                 (this->super_SegmentBase<duckdb::RowGroup>).start;
                            p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      ((long)&p_Var23->_vptr__Sp_counted_base + 1);
                          } while (p_Var23 < (ulong)local_110._0_8_);
                        }
                        if (FVar14 != FILTER_ALWAYS_TRUE) {
                          UnifiedVectorFormat::UnifiedVectorFormat
                                    ((UnifiedVectorFormat *)&local_78.__data);
                          uVar11 = local_110._40_8_;
                          Vector::ToUnifiedFormat
                                    ((Vector *)local_110._40_8_,local_110._0_8_,
                                     (UnifiedVectorFormat *)&local_78.__data);
                          in_stack_fffffffffffffeb8.ptr = (DuckTransaction *)local_110;
                          ColumnSegment::FilterSelection
                                    (&local_d8,(Vector *)uVar11,
                                     (UnifiedVectorFormat *)&local_78.__data,pvVar21->filter,
                                     (TableFilterState *)local_b0,local_110._0_8_,
                                     (idx_t *)in_stack_fffffffffffffeb8.ptr);
                          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_38);
                          }
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              local_78.__data.__list.__next !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_78.__data.__list.__next);
                          }
                        }
                      }
                    }
                    else {
                      pCVar17 = GetColumn(this,pvVar21->table_column_index);
                      in_stack_fffffffffffffeb8.ptr = transaction.transaction.ptr;
                      (*pCVar17->_vptr_ColumnData[0xd])
                                (pCVar17,*(idx_t *)(local_110._24_8_ + 8),
                                 (((unsafe_unique_array<ColumnScanState> *)
                                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   (local_110._24_8_ + 0x10))->_M_use_count)->
                                 super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                 )._M_t.
                                 super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                 .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                 _M_head_impl + __n,local_110._40_8_,&local_d8,local_110,
                                 transaction.transaction.ptr,transaction.transaction_id,
                                 transaction.start_time,pvVar21->filter,local_b0);
                    }
                  }
                  __n_00 = __n_00 + 1;
                  pSVar24 = (pTVar3->filters).filter_list.
                            super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                            super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pSVar31 = (pTVar3->filters).filter_list.
                            super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                            super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                } while (__n_00 < (ulong)(((long)pSVar31 - (long)pSVar24 >> 3) * -0x3333333333333333
                                         ));
              }
              for (; pSVar24 != pSVar31; pSVar24 = pSVar24 + 1) {
                if (pSVar24->always_true == false) {
                  pvVar19 = vector<duckdb::Vector,_true>::operator[]
                                      ((vector<duckdb::Vector,_true> *)local_110._16_8_,
                                       pSVar24->scan_column_index);
                  Vector::Slice(pvVar19,&local_d8,local_110._0_8_);
                }
              }
            }
            uVar11 = local_110._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              DataChunk::Reset((DataChunk *)local_110._16_8_);
              uVar12 = local_110._24_8_;
              if ((pTVar3->column_ids).
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (pTVar3->column_ids).
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                lVar27 = 0;
                uVar18 = 0;
                do {
                  pvVar16 = vector<duckdb::StorageIndex,_true>::operator[](local_e0,uVar18);
                  if (pvVar16->index != 0xffffffffffffffff) {
                    if ((local_110[0xc] != '\0') &&
                       (lVar10 = (long)(pTVar3->filters).column_has_filter.
                                       super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p,
                       uVar18 < (ulong)(pTVar3->filters).column_has_filter.
                                       super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                       _M_offset +
                                ((long)(pTVar3->filters).column_has_filter.
                                       super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                       _M_p - lVar10) * 8)) {
                      uVar22 = uVar18 + 0x3f;
                      if (-1 < (long)uVar18) {
                        uVar22 = uVar18;
                      }
                      if ((*(ulong *)(lVar10 + ((long)uVar22 >> 6) * 8 + -8 +
                                     (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) * 8
                                     ) >> (uVar18 & 0x3f) & 1) != 0) goto LAB_017d393e;
                    }
                    pCVar17 = GetColumn(this,pvVar16->index);
                    (*pCVar17->_vptr_ColumnData[0x10])
                              (pCVar17,(long)&((((unsafe_unique_array<ColumnScanState> *)
                                                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                 (uVar12 + 0x10))->_M_use_count)->
                                               super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                               )._M_t.
                                               super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                               .
                                               super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>
                                              ._M_head_impl)->current + lVar27,0x800);
                  }
LAB_017d393e:
                  uVar18 = uVar18 + 1;
                  lVar27 = lVar27 + 0x98;
                } while (uVar18 < (ulong)((long)(pTVar3->column_ids).
                                                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                                .
                                                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pTVar3->column_ids).
                                                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                                .
                                                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
              piVar1 = (idx_t *)(uVar12 + 8);
              *piVar1 = *piVar1 + 1;
              iVar15 = 2;
            }
            else {
              if ((pTVar3->column_ids).
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (pTVar3->column_ids).
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                uVar18 = 0;
                do {
                  if ((local_110[0xc] == '\0') ||
                     (lVar27 = (long)(pTVar3->filters).column_has_filter.
                                     super_vector<bool,_std::allocator<bool>_>.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     , (ulong)(pTVar3->filters).column_has_filter.
                              super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                       + ((long)(pTVar3->filters).column_has_filter.
                                super_vector<bool,_std::allocator<bool>_>.
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         lVar27) * 8 <= uVar18)) {
LAB_017d375b:
                    pvVar16 = vector<duckdb::StorageIndex,_true>::operator[](local_e0,uVar18);
                    if (pvVar16->index == 0xffffffffffffffff) {
                      pvVar19 = vector<duckdb::Vector,_true>::operator[]
                                          ((vector<duckdb::Vector,_true> *)local_110._16_8_,uVar18);
                      Vector::SetVectorType(pvVar19,FLAT_VECTOR);
                      pvVar19 = vector<duckdb::Vector,_true>::operator[]
                                          ((vector<duckdb::Vector,_true> *)local_110._16_8_,uVar18);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        pdVar9 = pvVar19->data;
                        p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        do {
                          p_Var23 = p_Var29;
                          if (local_d8.sel_vector != (sel_t *)0x0) {
                            p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      (ulong)local_d8.sel_vector[(long)p_Var29];
                          }
                          *(idx_t *)(pdVar9 + (long)p_Var29 * 8) =
                               (long)&p_Var23[iVar4 * 0x80]._vptr__Sp_counted_base +
                               (this->super_SegmentBase<duckdb::RowGroup>).start;
                          p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)&p_Var29->_vptr__Sp_counted_base + 1);
                        } while (p_Var29 < (ulong)local_110._0_8_);
                      }
                    }
                    else {
                      pCVar17 = GetColumn(this,pvVar16->index);
                      iVar8 = *(idx_t *)(local_110._24_8_ + 8);
                      _Var6._M_head_impl =
                           (((unsafe_unique_array<ColumnScanState> *)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             (local_110._24_8_ + 0x10))->_M_use_count)->
                           super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                           )._M_t.
                           super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                           .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                      pvVar19 = vector<duckdb::Vector,_true>::operator[]
                                          ((vector<duckdb::Vector,_true> *)local_110._16_8_,uVar18);
                      in_stack_fffffffffffffeb8.ptr =
                           in_stack_fffffffffffffeb8.ptr & 0xffffffff00000000;
                      (*pCVar17->_vptr_ColumnData[0xf])
                                (pCVar17,iVar8,_Var6._M_head_impl + uVar18,pvVar19,&local_d8,
                                 local_110._0_8_,in_stack_fffffffffffffeb8.ptr);
                    }
                  }
                  else {
                    uVar22 = uVar18 + 0x3f;
                    if (-1 < (long)uVar18) {
                      uVar22 = uVar18;
                    }
                    if ((*(ulong *)(lVar27 + ((long)uVar22 >> 6) * 8 + -8 +
                                   (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) * 8)
                         >> (uVar18 & 0x3f) & 1) == 0) goto LAB_017d375b;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 < (ulong)((long)(pTVar3->column_ids).
                                                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                                .
                                                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pTVar3->column_ids).
                                                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                                .
                                                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
              ScanFilterInfo::EndFilter
                        ((ScanFilterInfo *)local_c0._M_i,(AdaptiveFilterState)local_98._M_head_impl)
              ;
              iVar15 = 0;
              local_110._32_8_ = local_110._0_8_;
            }
            if (local_d8.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d8.selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11 ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_017d39a4;
          }
          (((shared_ptr<duckdb::DatabaseInstance,_true> *)(local_110._16_8_ + 0x10))->internal).
          super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._32_8_;
          *(idx_t *)(local_110._24_8_ + 8) = *(idx_t *)(local_110._24_8_ + 8) + 1;
          iVar15 = 3;
        }
      }
    }
    else {
      NextVector(this,(CollectionScanState *)uVar11);
      iVar15 = 2;
    }
LAB_017d39a4:
    if (iVar15 != 2) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroup::TemplatedScan(TransactionData transaction, CollectionScanState &state, DataChunk &result) {
	const bool ALLOW_UPDATES = TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_DISALLOW_UPDATES &&
	                           TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED;
	const auto &column_ids = state.GetColumnIds();
	auto &filter_info = state.GetFilterInfo();
	while (true) {
		if (state.vector_index * STANDARD_VECTOR_SIZE >= state.max_row_group_row) {
			// exceeded the amount of rows to scan
			return;
		}
		idx_t current_row = state.vector_index * STANDARD_VECTOR_SIZE;
		auto max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.max_row_group_row - current_row);

		// check the sampling info if we have to sample this chunk
		if (state.GetSamplingInfo().do_system_sample &&
		    state.random.NextRandom() > state.GetSamplingInfo().sample_rate) {
			NextVector(state);
			continue;
		}

		//! first check the zonemap if we have to scan this partition
		if (!CheckZonemapSegments(state)) {
			continue;
		}

		// second, scan the version chunk manager to figure out which tuples to load for this transaction
		idx_t count;
		if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
			count = state.row_group->GetSelVector(transaction, state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else if (TYPE == TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED) {
			count = state.row_group->GetCommittedSelVector(transaction.start_time, transaction.transaction_id,
			                                               state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else {
			count = max_count;
		}
		auto &block_manager = GetBlockManager();
#ifndef DUCKDB_ALTERNATIVE_VERIFY
		// // in regular operation we only prefetch from remote file systems
		// // when alternative verify is set, we always prefetch for testing purposes
		if (block_manager.IsRemote())
#else
		if (!block_manager.InMemory())
#endif
		{
			PrefetchState prefetch_state;
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (!column.IsRowIdColumn()) {
					GetColumn(column).InitializePrefetch(prefetch_state, state.column_scans[i], max_count);
				}
			}
			auto &buffer_manager = block_manager.buffer_manager;
			buffer_manager.Prefetch(prefetch_state.blocks);
		}

		bool has_filters = filter_info.HasFilters();
		if (count == max_count && !has_filters) {
			// scan all vectors completely: full scan without deletions or table filters
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					// scan row id
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].Sequence(UnsafeNumericCast<int64_t>(this->start + current_row), 1, count);
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE != TableScanType::TABLE_SCAN_REGULAR) {
						col_data.ScanCommitted(state.vector_index, state.column_scans[i], result.data[i],
						                       ALLOW_UPDATES);
					} else {
						col_data.Scan(transaction, state.vector_index, state.column_scans[i], result.data[i]);
					}
				}
			}
		} else {
			// partial scan: we have deletions or table filters
			idx_t approved_tuple_count = count;
			SelectionVector sel;
			if (count != max_count) {
				sel.Initialize(state.valid_sel);
			} else {
				sel.Initialize(nullptr);
			}
			//! first, we scan the columns with filters, fetch their data and generate a selection vector.
			//! get runtime statistics
			auto adaptive_filter = filter_info.GetAdaptiveFilter();
			auto filter_state = filter_info.BeginFilter();
			if (has_filters) {
				D_ASSERT(ALLOW_UPDATES);
				auto &filter_list = filter_info.GetFilterList();
				for (idx_t i = 0; i < filter_list.size(); i++) {
					auto filter_idx = adaptive_filter->permutation[i];
					auto &filter = filter_list[filter_idx];
					if (filter.IsAlwaysTrue()) {
						// this filter is always true - skip it
						continue;
					}
					auto &table_filter_state = *filter.filter_state;

					const auto scan_idx = filter.scan_column_index;
					const auto column_idx = filter.table_column_index;

					auto &result_vector = result.data[scan_idx];
					if (column_idx == COLUMN_IDENTIFIER_ROW_ID) {
						// We do another quick statistics scan for row ids here
						const auto rowid_start = this->start + current_row;
						const auto rowid_end = this->start + current_row + max_count;
						const auto prune_result = CheckRowIdFilter(filter.filter, rowid_start, rowid_end);
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
							// We can just break out of the loop here.
							approved_tuple_count = 0;
							continue;
						}

						// Generate row ids
						// Create sequence for row ids
						D_ASSERT(result_vector.GetType().InternalType() == ROW_TYPE);
						result_vector.SetVectorType(VectorType::FLAT_VECTOR);
						auto result_data = FlatVector::GetData<int64_t>(result_vector);
						for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
							result_data[sel.get_index(sel_idx)] =
							    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
						}

						// Was this filter always true? If so, we dont need to apply it
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
							continue;
						}

						// Now apply the filter
						UnifiedVectorFormat vdata;
						result_vector.ToUnifiedFormat(approved_tuple_count, vdata);
						ColumnSegment::FilterSelection(sel, result_vector, vdata, filter.filter, table_filter_state,
						                               approved_tuple_count, approved_tuple_count);

					} else {
						auto &col_data = GetColumn(filter.table_column_index);
						col_data.Filter(transaction, state.vector_index, state.column_scans[scan_idx], result_vector,
						                sel, approved_tuple_count, filter.filter, table_filter_state);
					}
				}
				for (auto &table_filter : filter_list) {
					if (table_filter.IsAlwaysTrue()) {
						continue;
					}
					result.data[table_filter.scan_column_index].Slice(sel, approved_tuple_count);
				}
			}
			if (approved_tuple_count == 0) {
				// all rows were filtered out by the table filters
				D_ASSERT(has_filters);
				result.Reset();
				// skip this vector in all the scans that were not scanned yet
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto &col_idx = column_ids[i];
					if (col_idx.IsRowIdColumn()) {
						continue;
					}
					if (has_filters && filter_info.ColumnHasFilters(i)) {
						continue;
					}
					auto &col_data = GetColumn(col_idx);
					col_data.Skip(state.column_scans[i]);
				}
				state.vector_index++;
				continue;
			}
			//! Now we use the selection vector to fetch data for the other columns.
			for (idx_t i = 0; i < column_ids.size(); i++) {
				if (has_filters && filter_info.ColumnHasFilters(i)) {
					// column has already been scanned as part of the filtering process
					continue;
				}
				auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].SetVectorType(VectorType::FLAT_VECTOR);
					auto result_data = FlatVector::GetData<int64_t>(result.data[i]);
					for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
						result_data[sel_idx] =
						    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
					}
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
						col_data.Select(transaction, state.vector_index, state.column_scans[i], result.data[i], sel,
						                approved_tuple_count);
					} else {
						col_data.SelectCommitted(state.vector_index, state.column_scans[i], result.data[i], sel,
						                         approved_tuple_count, ALLOW_UPDATES);
					}
				}
			}
			filter_info.EndFilter(filter_state);

			D_ASSERT(approved_tuple_count > 0);
			count = approved_tuple_count;
		}
		result.SetCardinality(count);
		state.vector_index++;
		break;
	}
}